

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O2

void define_gf_group(AV1_COMP *cpi,EncodeFrameParams *frame_params,int is_final_pass)

{
  int *piVar1;
  TWO_PASS_FRAME *twopass_frame;
  TWO_PASS *twopass;
  FRAME_INFO *frame_info;
  FRAME_UPDATE_TYPE FVar2;
  byte bVar3;
  AV1_PRIMARY *pAVar4;
  FIRSTPASS_STATS *begin;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined4 uVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  uint uVar15;
  int idx_1;
  AV1_PRIMARY *pAVar16;
  ulong uVar17;
  int cur_index;
  bool bVar18;
  bool bVar19;
  double dVar20;
  int local_23c;
  int i;
  FIRSTPASS_STATS *local_230;
  RATE_CONTROL *local_228;
  int local_21c;
  FRAME_INFO *local_218;
  PRIMARY_RATE_CONTROL *local_210;
  GF_GROUP *local_208;
  int *local_200;
  int *local_1f8;
  EncodeFrameParams *local_1f0;
  uint local_1e8 [8];
  int layer_frames [7];
  GF_GROUP_STATS local_1a8;
  FIRSTPASS_STATS next_frame;
  
  local_228 = (RATE_CONTROL *)CONCAT44(local_228._4_4_,is_final_pass);
  pAVar4 = cpi->ppi;
  local_230 = (cpi->twopass_frame).stats_in;
  local_208 = &pAVar4->gf_group;
  iVar5 = (cpi->common).width;
  bVar18 = (cpi->rc).frames_since_key == 0;
  iVar7 = (cpi->common).height;
  pAVar4->internal_altref_allowed = (uint)(1 < (cpi->oxcf).gf_cfg.gf_max_pyr_height);
  pAVar16 = pAVar4;
  local_1f0 = frame_params;
  if (!bVar18) {
    memset(local_208,0,0x58f4);
    cpi->gf_frame_index = '\0';
    pAVar16 = cpi->ppi;
  }
  if ((cpi->oxcf).pass == AOM_RC_ONE_PASS) {
    if (pAVar16->lap_enabled == 0) {
      if ((cpi->oxcf).q_cfg.aq_mode == '\x03') {
        av1_cyclic_refresh_set_golden_update(cpi);
      }
      else {
        iVar5 = (pAVar16->p_rc).cur_gf_index;
        (pAVar16->p_rc).baseline_gf_interval = (pAVar16->p_rc).gf_intervals[iVar5];
        piVar1 = &(cpi->rc).intervals_till_gf_calculate_due;
        *piVar1 = *piVar1 + -1;
        (pAVar16->p_rc).cur_gf_index = iVar5 + 1;
      }
      correct_frames_to_key(cpi);
      iVar5 = (pAVar16->p_rc).baseline_gf_interval;
      iVar7 = (cpi->rc).frames_to_key;
      if (iVar7 < iVar5) {
        (pAVar16->p_rc).baseline_gf_interval = iVar7;
        iVar5 = iVar7;
      }
      (pAVar16->p_rc).gfu_boost = 2000;
      (pAVar16->p_rc).constrained_gf_group = (uint)(iVar7 <= iVar5);
      (pAVar16->gf_group).max_layer_depth_allowed = (cpi->oxcf).gf_cfg.gf_max_pyr_height;
      iVar7 = (cpi->oxcf).gf_cfg.lag_in_frames;
      if ((((iVar7 < iVar5) || (iVar7 < 3)) || ((cpi->oxcf).gf_cfg.enable_auto_arf == false)) ||
         (iVar5 < (cpi->rc).min_gf_interval)) {
        (pAVar16->gf_group).max_layer_depth_allowed = 0;
      }
      av1_gop_setup_structure(cpi);
      for (lVar10 = 0; lVar10 < (pAVar16->gf_group).size; lVar10 = lVar10 + 1) {
        FVar2 = (pAVar16->gf_group).update_type[lVar10];
        if ((cpi->oxcf).rc_cfg.mode == AOM_CBR) {
          if (FVar2 == '\0') {
            iVar5 = av1_calc_iframe_target_size_one_pass_cbr(cpi);
          }
          else {
            iVar5 = av1_calc_pframe_target_size_one_pass_cbr(cpi,FVar2);
          }
        }
        else if (FVar2 == '\0') {
          iVar5 = av1_calc_iframe_target_size_one_pass_vbr(cpi);
        }
        else {
          iVar5 = av1_calc_pframe_target_size_one_pass_vbr(cpi,FVar2);
        }
        (pAVar16->gf_group).bit_allocation[lVar10] = iVar5;
      }
      return;
    }
LAB_001d7224:
    correct_frames_to_key(cpi);
  }
  else if (pAVar16->lap_enabled != 0) goto LAB_001d7224;
  uVar9 = (uint)bVar18;
  local_218 = (FRAME_INFO *)CONCAT44(local_218._4_4_,uVar9);
  accumulate_gop_stats(cpi,uVar9,iVar5,iVar7,&next_frame,local_230,&local_1a8,&i);
  iVar13 = (cpi->oxcf).gf_cfg.gf_min_pyr_height;
  iVar6 = (cpi->rc).min_gf_interval;
  if (((iVar13 < 2) && (0.95 < local_1a8.zero_motion_accumulator)) &&
     ((local_1a8.avg_sr_coded_error < 40.0 && (local_1a8.avg_raw_err_stdev < 2000.0)))) {
    cpi->ppi->internal_altref_allowed = 0;
  }
  if (iVar13 == 0) {
    if (cpi->ppi->lap_enabled == 0) {
      if ((local_1a8.zero_motion_accumulator < 0.995) || ((pAVar4->twopass).kf_zeromotion_pct < 99))
      goto LAB_001d7356;
    }
    else if (local_1a8.zero_motion_accumulator < 0.999) {
LAB_001d7356:
      bVar18 = true;
      if ((pAVar4->p_rc).use_arf_in_this_kf_group != 0) {
        iVar13 = 0;
        bVar3 = 0;
        local_23c = 0;
        if (i < (cpi->oxcf).gf_cfg.lag_in_frames && 3 < i) goto LAB_001d738f;
        goto LAB_001d73b4;
      }
    }
LAB_001d73aa:
    bVar18 = true;
    iVar13 = 0;
    bVar3 = 0;
    local_23c = 0;
  }
  else {
    bVar18 = true;
    if ((pAVar4->p_rc).use_arf_in_this_kf_group == 0) goto LAB_001d73aa;
    iVar13 = 0;
    bVar3 = 0;
    local_23c = 0;
    if (2 < i && i < (cpi->oxcf).gf_cfg.lag_in_frames) {
LAB_001d738f:
      local_23c = 1;
      iVar13 = (cpi->oxcf).gf_cfg.gf_max_pyr_height;
      bVar3 = 1;
      bVar18 = false;
    }
  }
LAB_001d73b4:
  (pAVar4->gf_group).max_layer_depth_allowed = iVar13;
  if ((((cpi->oxcf).rc_cfg.mode == AOM_Q) && ((cpi->oxcf).rc_cfg.cq_level < 0x81)) ||
     (cpi->ppi->internal_altref_allowed == 0)) {
    bVar19 = true;
    if ((cpi->oxcf).rc_cfg.best_allowed_q == 0) {
      bVar19 = (cpi->oxcf).rc_cfg.worst_allowed_q != 0;
    }
    if (!(bool)(bVar3 & bVar19)) goto LAB_001d7438;
    iVar13 = (cpi->rc).frames_to_key - i;
    local_21c = 0;
    bVar19 = false;
    if (9 < i) {
      if (iVar13 < 8) {
        bVar19 = iVar6 <= iVar13 + 1;
      }
      else {
        bVar19 = false;
      }
    }
    if ((bool)(iVar6 + 1 < i & ((4 < i && iVar13 == 0) | bVar19))) {
      i = i + -1;
      if ((int)local_228 != 0) {
        (cpi->rc).intervals_till_gf_calculate_due = 0;
      }
      piVar1 = (pAVar4->p_rc).gf_intervals + (pAVar4->p_rc).cur_gf_index;
      *piVar1 = *piVar1 + -1;
      (cpi->twopass_frame).stats_in = local_230;
      accumulate_gop_stats(cpi,(int)local_218,iVar5,iVar7,&next_frame,local_230,&local_1a8,&i);
      local_21c = -1;
    }
  }
  else {
LAB_001d7438:
    local_21c = 0;
  }
  iVar5 = i;
  if ((int)local_228 != 0) {
    piVar1 = &(cpi->rc).intervals_till_gf_calculate_due;
    *piVar1 = *piVar1 + -1;
    piVar1 = &(pAVar4->p_rc).cur_gf_index;
    *piVar1 = *piVar1 + 1;
  }
  twopass_frame = &cpi->twopass_frame;
  (pAVar4->p_rc).constrained_gf_group = (uint)((cpi->rc).frames_to_key <= i);
  (pAVar4->p_rc).baseline_gf_interval = i;
  (cpi->rc).frames_till_gf_update_due = i;
  av1_gop_setup_structure(cpi);
  iVar7 = local_21c;
  pAVar4 = cpi->ppi;
  local_210 = &pAVar4->p_rc;
  twopass = &pAVar4->twopass;
  frame_info = &cpi->frame_info;
  iVar13 = iVar5 - (int)local_218;
  if (bVar18) {
    twopass_frame->stats_in = local_230;
    local_1f8 = &(pAVar4->p_rc).num_stats_used_for_gfu_boost;
    local_200 = &(pAVar4->p_rc).num_stats_required_for_gfu_boost;
    local_218 = frame_info;
    iVar5 = av1_calc_arf_boost(twopass,twopass_frame,local_210,frame_info,local_21c,iVar13,0,
                               local_1f8,local_200,pAVar4->lap_enabled);
    iVar6 = 0x1518;
    if (iVar5 < 0x1519) {
      iVar6 = av1_calc_arf_boost(twopass,twopass_frame,local_210,local_218,iVar7,iVar13,0,local_1f8,
                                 local_200,cpi->ppi->lap_enabled);
    }
    (pAVar4->p_rc).gfu_boost = iVar6;
    (pAVar4->p_rc).arf_boost_factor = 1.0;
  }
  else {
    iVar5 = (cpi->rc).frames_to_key - iVar5;
    iVar7 = 0;
    if (0 < iVar5) {
      iVar7 = iVar5;
    }
    if (iVar13 <= iVar5) {
      iVar7 = iVar13;
    }
    iVar5 = av1_calc_arf_boost(twopass,twopass_frame,local_210,frame_info,local_21c,iVar7,iVar13,
                               &(pAVar4->p_rc).num_stats_used_for_gfu_boost,
                               &(pAVar4->p_rc).num_stats_required_for_gfu_boost,pAVar4->lap_enabled)
    ;
    (pAVar4->p_rc).gfu_boost = iVar5;
    (pAVar4->p_rc).arf_boost_factor = 1.0;
    if ((((cpi->oxcf).rc_cfg.best_allowed_q != 0) || ((cpi->oxcf).rc_cfg.worst_allowed_q != 0)) &&
       ((uint)((cpi->rc).frames_to_key - iVar13) < 2)) {
      (pAVar4->p_rc).arf_boost_factor = 0.2;
    }
  }
  begin = local_230;
  (cpi->twopass_frame).stats_in = local_230;
  pAVar16 = cpi->ppi;
  if (pAVar16->lap_enabled != 0) {
    local_1a8.gf_group_err = (double)(pAVar4->p_rc).baseline_gf_interval;
  }
  lVar10 = (long)(cpi->oxcf).rc_cfg.vbrmax_section * (long)(cpi->rc).avg_frame_bandwidth;
  if (lVar10 < -99) {
    lVar11 = 0;
  }
  else {
    lVar10 = lVar10 / 100;
    lVar11 = (long)(cpi->rc).max_frame_bandwidth;
    if (lVar10 < lVar11) {
      lVar11 = lVar10;
    }
  }
  lVar10 = (pAVar16->twopass).kf_group_bits;
  if ((lVar10 < 1) || (dVar20 = (pAVar16->twopass).kf_group_error_left, dVar20 <= 0.0)) {
    lVar12 = 0;
LAB_001d7693:
    if (lVar12 < lVar10) {
      lVar10 = lVar12;
    }
  }
  else {
    lVar12 = (long)((local_1a8.gf_group_err / dVar20) * (double)lVar10);
    if (-1 < lVar12) goto LAB_001d7693;
    lVar10 = 0;
  }
  lVar11 = lVar11 * (pAVar16->p_rc).baseline_gf_interval;
  if (lVar10 < lVar11) {
    lVar11 = lVar10;
  }
  local_210->gf_group_bits = lVar11;
  if ((cpi->oxcf).rc_cfg.mode == AOM_Q) {
LAB_001d774c:
    if ((int)local_228 == 0) {
      uVar8 = (undefined4)CONCAT71((int7)((ulong)lVar11 >> 8),1);
      goto LAB_001d776f;
    }
  }
  else {
    iVar5 = (pAVar4->p_rc).baseline_gf_interval;
    if ((int)local_228 == 0 || (long)iVar5 < 2) goto LAB_001d774c;
    dVar20 = (double)iVar5;
    local_230 = (FIRSTPASS_STATS *)local_1a8.gf_group_err;
    iVar7 = get_twopass_worst_quality
                      (cpi,local_1a8.gf_group_raw_error / dVar20,
                       (local_1a8.gf_group_inactive_zone_rows +
                       local_1a8.gf_group_inactive_zone_rows) /
                       ((double)(cpi->common).mi_params.mb_rows * dVar20) +
                       local_1a8.gf_group_skip_pct / dVar20,(int)(lVar11 / (long)iVar5));
    iVar5 = (cpi->rc).active_worst_quality >> 1;
    if (iVar5 < iVar7) {
      iVar5 = iVar7;
    }
    (cpi->rc).active_worst_quality = iVar5;
    local_1a8.gf_group_err = (double)local_230;
  }
  (pAVar4->twopass).kf_group_error_left =
       (pAVar4->twopass).kf_group_error_left - local_1a8.gf_group_err;
  uVar8 = 0;
LAB_001d776f:
  local_230 = (FIRSTPASS_STATS *)CONCAT44(local_230._4_4_,uVar8);
  local_228 = &cpi->rc;
  (cpi->twopass_frame).stats_in = begin;
  iVar5 = (cpi->rc).frames_since_key;
  if (iVar5 != 0) {
    uVar9 = calculate_section_intra_ratio
                      (begin,((pAVar4->twopass).stats_buf_ctx)->stats_in_end,
                       (pAVar4->p_rc).baseline_gf_interval);
    (pAVar4->twopass).section_intra_rating = uVar9;
  }
  lVar10 = (pAVar4->p_rc).gf_group_bits;
  pAVar16 = cpi->ppi;
  iVar7 = calculate_boost_bits
                    ((pAVar16->p_rc).baseline_gf_interval - (uint)(iVar5 == 0),
                     (pAVar16->p_rc).gfu_boost,lVar10);
  iVar6 = adjust_boost_bits_for_target_level(cpi,local_228,iVar7,lVar10,1);
  iVar7 = (pAVar4->gf_group).size;
  lVar11 = (long)iVar7;
  layer_frames[4] = 0;
  layer_frames[5] = 0;
  layer_frames[6] = 0;
  layer_frames[0] = 0;
  layer_frames[1] = 0;
  layer_frames[2] = 0;
  layer_frames[3] = 0;
  uVar9 = (pAVar16->p_rc).baseline_gf_interval - (uint)((cpi->rc).frames_since_key == 0);
  iVar13 = (pAVar4->gf_group).max_layer_depth;
  uVar17 = (ulong)(iVar5 == 0);
  for (uVar14 = uVar17; (long)uVar14 < lVar11; uVar14 = uVar14 + 1) {
    FVar2 = (pAVar4->gf_group).update_type[uVar14];
    if ((FVar2 == '\x06') || (FVar2 == '\x03')) {
      layer_frames[(pAVar4->gf_group).layer_depth[uVar14]] =
           layer_frames[(pAVar4->gf_group).layer_depth[uVar14]] + 1;
    }
  }
  if ((int)uVar9 < 2) {
    uVar9 = 1;
  }
  local_1e8[4] = 0;
  local_1e8[5] = 0;
  local_1e8[6] = 0;
  local_1e8[0] = 0;
  local_1e8[1] = 0;
  local_1e8[2] = 0;
  local_1e8[3] = 0;
  iVar5 = iVar6;
  for (uVar14 = 1; (long)uVar14 < (long)iVar13; uVar14 = uVar14 + 1) {
    dVar20 = 1.0;
    if (iVar13 - 1 != uVar14) {
      dVar20 = *(double *)(allocate_gf_group_bits_layer_fraction + uVar14 * 8);
    }
    uVar15 = layer_frames[uVar14];
    if (layer_frames[uVar14] < 2) {
      uVar15 = 1;
    }
    local_1e8[uVar14] = (int)(((double)iVar5 * dVar20) / (double)(int)uVar15);
    iVar5 = iVar5 - (int)((double)iVar5 * dVar20);
  }
  lVar12 = 0;
  if (!bVar18) {
    lVar12 = (long)iVar6;
  }
  for (; (long)uVar17 < lVar11; uVar17 = uVar17 + 1) {
    bVar3 = (pAVar4->gf_group).update_type[uVar17];
    iVar5 = 0;
    if ((1 < bVar3 - 4) &&
       ((iVar5 = (int)((lVar10 - lVar12) / (long)(ulong)uVar9), bVar3 == 6 || (bVar3 == 3)))) {
      bVar18 = (int)(local_1e8[(pAVar4->gf_group).layer_depth[uVar17]] ^ 0x7fffffff) < iVar5;
      iVar5 = local_1e8[(pAVar4->gf_group).layer_depth[uVar17]] + iVar5;
      if (bVar18) {
        iVar5 = 0x7fffffff;
      }
    }
    (pAVar4->gf_group).bit_allocation[uVar17] = iVar5;
  }
  if (iVar7 < 0xfa) {
    (pAVar4->gf_group).bit_allocation[lVar11] = 0;
  }
  if ((char)local_230 == '\0') {
    (cpi->ppi->gf_state).arf_gf_boost_lst = local_23c;
    (pAVar4->twopass).rolling_arf_group_target_bits = 1;
    (pAVar4->twopass).rolling_arf_group_actual_bits = 1;
  }
  local_1f0->frame_type = (cpi->rc).frames_since_key != 0;
  local_1f0->show_frame =
       (uint)(local_208->update_type[cpi->gf_frame_index] != '\x06' &&
             local_208->update_type[cpi->gf_frame_index] != '\x03');
  return;
}

Assistant:

static void define_gf_group(AV1_COMP *cpi, EncodeFrameParams *frame_params,
                            int is_final_pass) {
  AV1_COMMON *const cm = &cpi->common;
  RATE_CONTROL *const rc = &cpi->rc;
  PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  const AV1EncoderConfig *const oxcf = &cpi->oxcf;
  TWO_PASS *const twopass = &cpi->ppi->twopass;
  FIRSTPASS_STATS next_frame;
  const FIRSTPASS_STATS *const start_pos = cpi->twopass_frame.stats_in;
  GF_GROUP *gf_group = &cpi->ppi->gf_group;
  const GFConfig *const gf_cfg = &oxcf->gf_cfg;
  const RateControlCfg *const rc_cfg = &oxcf->rc_cfg;
  const int f_w = cm->width;
  const int f_h = cm->height;
  int i;
  const int is_intra_only = rc->frames_since_key == 0;

  cpi->ppi->internal_altref_allowed = (gf_cfg->gf_max_pyr_height > 1);

  // Reset the GF group data structures unless this is a key
  // frame in which case it will already have been done.
  if (!is_intra_only) {
    av1_zero(cpi->ppi->gf_group);
    cpi->gf_frame_index = 0;
  }

  if (has_no_stats_stage(cpi)) {
    define_gf_group_pass0(cpi);
    return;
  }

#if CONFIG_THREE_PASS
  if (cpi->third_pass_ctx && oxcf->pass == AOM_RC_THIRD_PASS) {
    int ret = define_gf_group_pass3(cpi, frame_params, is_final_pass);
    if (ret == 0) return;

    av1_free_thirdpass_ctx(cpi->third_pass_ctx);
    cpi->third_pass_ctx = NULL;
  }
#endif  // CONFIG_THREE_PASS

  // correct frames_to_key when lookahead queue is emptying
  if (cpi->ppi->lap_enabled) {
    correct_frames_to_key(cpi);
  }

  GF_GROUP_STATS gf_stats;
  accumulate_gop_stats(cpi, is_intra_only, f_w, f_h, &next_frame, start_pos,
                       &gf_stats, &i);

  const int can_disable_arf = !gf_cfg->gf_min_pyr_height;

  // If this is a key frame or the overlay from a previous arf then
  // the error score / cost of this frame has already been accounted for.
  const int active_min_gf_interval = rc->min_gf_interval;

  // Disable internal ARFs for "still" gf groups.
  //   zero_motion_accumulator: minimum percentage of (0,0) motion;
  //   avg_sr_coded_error:      average of the SSE per pixel of each frame;
  //   avg_raw_err_stdev:       average of the standard deviation of (0,0)
  //                            motion error per block of each frame.
  const int can_disable_internal_arfs = gf_cfg->gf_min_pyr_height <= 1;
  if (can_disable_internal_arfs &&
      gf_stats.zero_motion_accumulator > MIN_ZERO_MOTION &&
      gf_stats.avg_sr_coded_error < MAX_SR_CODED_ERROR &&
      gf_stats.avg_raw_err_stdev < MAX_RAW_ERR_VAR) {
    cpi->ppi->internal_altref_allowed = 0;
  }

  int use_alt_ref;
  if (can_disable_arf) {
    use_alt_ref =
        !is_almost_static(gf_stats.zero_motion_accumulator,
                          twopass->kf_zeromotion_pct, cpi->ppi->lap_enabled) &&
        p_rc->use_arf_in_this_kf_group && (i < gf_cfg->lag_in_frames) &&
        (i >= MIN_GF_INTERVAL);
  } else {
    use_alt_ref = p_rc->use_arf_in_this_kf_group &&
                  (i < gf_cfg->lag_in_frames) && (i > 2);
  }
  if (use_alt_ref) {
    gf_group->max_layer_depth_allowed = gf_cfg->gf_max_pyr_height;
  } else {
    gf_group->max_layer_depth_allowed = 0;
  }

  int alt_offset = 0;
  // The length reduction strategy is tweaked for certain cases, and doesn't
  // work well for certain other cases.
  const int allow_gf_length_reduction =
      ((rc_cfg->mode == AOM_Q && rc_cfg->cq_level <= 128) ||
       !cpi->ppi->internal_altref_allowed) &&
      !is_lossless_requested(rc_cfg);

  if (allow_gf_length_reduction && use_alt_ref) {
    // adjust length of this gf group if one of the following condition met
    // 1: only one overlay frame left and this gf is too long
    // 2: next gf group is too short to have arf compared to the current gf

    // maximum length of next gf group
    const int next_gf_len = rc->frames_to_key - i;
    const int single_overlay_left =
        next_gf_len == 0 && i > REDUCE_GF_LENGTH_THRESH;
    // the next gf is probably going to have a ARF but it will be shorter than
    // this gf
    const int unbalanced_gf =
        i > REDUCE_GF_LENGTH_TO_KEY_THRESH &&
        next_gf_len + 1 < REDUCE_GF_LENGTH_TO_KEY_THRESH &&
        next_gf_len + 1 >= rc->min_gf_interval;

    if (single_overlay_left || unbalanced_gf) {
      const int roll_back = REDUCE_GF_LENGTH_BY;
      // Reduce length only if active_min_gf_interval will be respected later.
      if (i - roll_back >= active_min_gf_interval + 1) {
        alt_offset = -roll_back;
        i -= roll_back;
        if (is_final_pass) rc->intervals_till_gf_calculate_due = 0;
        p_rc->gf_intervals[p_rc->cur_gf_index] -= roll_back;
        reset_fpf_position(&cpi->twopass_frame, start_pos);
        accumulate_gop_stats(cpi, is_intra_only, f_w, f_h, &next_frame,
                             start_pos, &gf_stats, &i);
      }
    }
  }

  update_gop_length(rc, p_rc, i, is_final_pass);

  // Set up the structure of this Group-Of-Pictures (same as GF_GROUP)
  av1_gop_setup_structure(cpi);

  set_gop_bits_boost(cpi, i, is_intra_only, is_final_pass, use_alt_ref,
                     alt_offset, start_pos, &gf_stats);

  frame_params->frame_type =
      rc->frames_since_key == 0 ? KEY_FRAME : INTER_FRAME;
  frame_params->show_frame =
      !(gf_group->update_type[cpi->gf_frame_index] == ARF_UPDATE ||
        gf_group->update_type[cpi->gf_frame_index] == INTNL_ARF_UPDATE);
}